

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void transaction_simple_api_test(void)

{
  int iVar1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_kvs_handle *db_txn2;
  fdb_kvs_handle *db_txn1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn2;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  void *value;
  size_t valuelen;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffb88;
  fdb_file_handle *in_stack_fffffffffffffb90;
  fdb_isolation_level_t isolation_level;
  void **ppvVar2;
  fdb_file_handle *in_stack_fffffffffffffb98;
  void **in_stack_fffffffffffffba0;
  fdb_kvs_handle *in_stack_fffffffffffffba8;
  void **in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  void **in_stack_fffffffffffffbc0;
  fdb_kvs_handle *in_stack_fffffffffffffbc8;
  char local_2a8 [80];
  fdb_config *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  fdb_file_handle **in_stack_fffffffffffffdb8;
  void *local_1a8 [32];
  fdb_status local_a4;
  size_t local_a0;
  fdb_kvs_handle *local_98;
  fdb_kvs_handle *local_90;
  void *local_70;
  size_t local_68;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_5c = 10;
  local_58 = system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fdb_open(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fdb_kvs_open_default
            (in_stack_fffffffffffffb90,(fdb_kvs_handle **)in_stack_fffffffffffffb88,
             (fdb_kvs_config *)0x1182a4);
  local_a4 = fdb_set_log_callback(local_90,logCallbackFunc,"transaction_simple_api_test");
  if (local_a4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xd3f);
    transaction_simple_api_test::__test_pass = 0;
    if (local_a4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd3f,"void transaction_simple_api_test()");
    }
  }
  for (local_54 = 0; (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf((char *)local_1a8,"key%d",(ulong)local_54);
    sprintf(local_2a8,"body%d",(ulong)local_54);
    strlen((char *)local_1a8);
    strlen(local_2a8);
    local_a4 = fdb_set_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                          in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                          (size_t)in_stack_fffffffffffffba8);
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd46);
      transaction_simple_api_test::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xd46,"void transaction_simple_api_test()");
      }
    }
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffb88,'\0');
  fdb_open(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fdb_open(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fdb_kvs_open_default
            (in_stack_fffffffffffffb90,(fdb_kvs_handle **)in_stack_fffffffffffffb88,
             (fdb_kvs_config *)0x1184e6);
  fdb_kvs_open_default
            (in_stack_fffffffffffffb90,(fdb_kvs_handle **)in_stack_fffffffffffffb88,
             (fdb_kvs_config *)0x118503);
  isolation_level = (fdb_isolation_level_t)((ulong)in_stack_fffffffffffffb90 >> 0x38);
  fdb_begin_transaction(in_stack_fffffffffffffb98,isolation_level);
  fdb_begin_transaction(in_stack_fffffffffffffb98,isolation_level);
  for (local_54 = 0; (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf((char *)local_1a8,"key%d",(ulong)local_54);
    sprintf(local_2a8,"body%d_txn1",(ulong)local_54);
    strlen((char *)local_1a8);
    strlen(local_2a8);
    fdb_set_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
    sprintf((char *)local_1a8,"key%d",(ulong)local_54);
    sprintf(local_2a8,"body%d_txn2",(ulong)local_54);
    strlen((char *)local_1a8);
    strlen(local_2a8);
    fdb_set_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
  }
  local_54 = 0;
  while( true ) {
    if (local_5c <= (int)local_54) {
      fdb_end_transaction((fdb_file_handle *)in_stack_fffffffffffffba8,
                          (fdb_commit_opt_t)((ulong)in_stack_fffffffffffffba0 >> 0x38));
      local_54 = 0;
      while( true ) {
        if (local_5c <= (int)local_54) {
          fdb_end_transaction((fdb_file_handle *)in_stack_fffffffffffffba8,
                              (fdb_commit_opt_t)((ulong)in_stack_fffffffffffffba0 >> 0x38));
          local_54 = 0;
          while( true ) {
            if (local_5c <= (int)local_54) {
              fdb_close((fdb_file_handle *)in_stack_fffffffffffffb88);
              fdb_close((fdb_file_handle *)in_stack_fffffffffffffb88);
              fdb_close((fdb_file_handle *)in_stack_fffffffffffffb88);
              fdb_shutdown();
              memleak_end();
              if (transaction_simple_api_test::__test_pass == 0) {
                fprintf(_stderr,"%s FAILED\n","transaction simple API test");
              }
              else {
                fprintf(_stderr,"%s PASSED\n","transaction simple API test");
              }
              return;
            }
            sprintf((char *)local_1a8,"key%d",(ulong)local_54);
            sprintf(local_2a8,"body%d_txn2",(ulong)local_54);
            ppvVar2 = local_1a8;
            in_stack_fffffffffffffb88 = local_90;
            strlen((char *)local_1a8);
            local_a4 = fdb_get_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                                  in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                                  (size_t *)in_stack_fffffffffffffba8);
            if (local_a4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xd96);
              transaction_simple_api_test::__test_pass = 0;
              if (local_a4 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                              ,0xd96,"void transaction_simple_api_test()");
              }
            }
            iVar1 = memcmp(local_70,local_2a8,local_68);
            if (iVar1 != 0) break;
            fdb_free_block((void *)0x1190a5);
            local_54 = local_54 + 1;
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_2a8,local_70,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd97,in_stack_fffffffffffffb88,ppvVar2);
          transaction_simple_api_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xd97,"void transaction_simple_api_test()");
        }
        sprintf((char *)local_1a8,"key%d",(ulong)local_54);
        sprintf(local_2a8,"body%d_txn1",(ulong)local_54);
        in_stack_fffffffffffffbb0 = local_1a8;
        in_stack_fffffffffffffba8 = local_90;
        strlen((char *)local_1a8);
        local_a4 = fdb_get_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                              in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                              (size_t *)in_stack_fffffffffffffba8);
        if (local_a4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd81);
          transaction_simple_api_test::__test_pass = 0;
          if (local_a4 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xd81,"void transaction_simple_api_test()");
          }
        }
        iVar1 = memcmp(local_70,local_2a8,local_68);
        if (iVar1 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_2a8,local_70,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd82);
          transaction_simple_api_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xd82,"void transaction_simple_api_test()");
        }
        local_a4 = fdb_free_block((void *)0x118cff);
        if (local_a4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd84);
          transaction_simple_api_test::__test_pass = 0;
          if (local_a4 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xd84,"void transaction_simple_api_test()");
          }
        }
        sprintf((char *)local_1a8,"key%d",(ulong)local_54);
        sprintf(local_2a8,"body%d_txn2",(ulong)local_54);
        in_stack_fffffffffffffba0 = local_1a8;
        strlen((char *)local_1a8);
        local_a4 = fdb_get_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                              in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                              (size_t *)in_stack_fffffffffffffba8);
        if (local_a4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd8a);
          transaction_simple_api_test::__test_pass = 0;
          if (local_a4 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xd8a,"void transaction_simple_api_test()");
          }
        }
        iVar1 = memcmp(local_70,local_2a8,local_68);
        if (iVar1 != 0) break;
        fdb_free_block((void *)0x118ee7);
        local_54 = local_54 + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_2a8,local_70,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd8b);
      transaction_simple_api_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd8b,"void transaction_simple_api_test()");
    }
    sprintf((char *)local_1a8,"key%d",(ulong)local_54);
    sprintf(local_2a8,"body%d",(ulong)local_54);
    strlen((char *)local_1a8);
    local_a4 = fdb_get_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                          in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                          (size_t *)in_stack_fffffffffffffba8);
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd65);
      transaction_simple_api_test::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xd65,"void transaction_simple_api_test()");
      }
    }
    iVar1 = memcmp(local_70,local_2a8,local_68);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_2a8,local_70,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd66);
      transaction_simple_api_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd66,"void transaction_simple_api_test()");
    }
    fdb_free_block((void *)0x118847);
    sprintf((char *)local_1a8,"key%d",(ulong)local_54);
    sprintf(local_2a8,"body%d_txn1",(ulong)local_54);
    in_stack_fffffffffffffbc8 = local_98;
    strlen((char *)local_1a8);
    local_a4 = fdb_get_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                          in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                          (size_t *)in_stack_fffffffffffffba8);
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd6d);
      transaction_simple_api_test::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xd6d,"void transaction_simple_api_test()");
      }
    }
    iVar1 = memcmp(local_70,local_2a8,local_68);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_2a8,local_70,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd6e);
      transaction_simple_api_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd6e,"void transaction_simple_api_test()");
    }
    fdb_free_block((void *)0x1189c3);
    sprintf((char *)local_1a8,"key%d",(ulong)local_54);
    sprintf(local_2a8,"body%d_txn2",(ulong)local_54);
    in_stack_fffffffffffffbc0 = local_1a8;
    in_stack_fffffffffffffbb8 = local_a0;
    strlen((char *)local_1a8);
    local_a4 = fdb_get_kv(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                          in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                          (size_t *)in_stack_fffffffffffffba8);
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd75);
      transaction_simple_api_test::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xd75,"void transaction_simple_api_test()");
      }
    }
    iVar1 = memcmp(local_70,local_2a8,local_68);
    if (iVar1 != 0) break;
    fdb_free_block((void *)0x118b3f);
    local_54 = local_54 + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_2a8,local_70,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xd76);
  transaction_simple_api_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xd76,"void transaction_simple_api_test()");
}

Assistant:

void transaction_simple_api_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2;
    fdb_kvs_handle *db, *db_txn1, *db_txn2;
    fdb_status status;

    char keybuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_simple_api_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db and begin transactions
    fdb_open(&dbfile_txn1, "./mvcc_test1", &fconfig);
    fdb_open(&dbfile_txn2, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_set_kv(db_txn1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));

        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        fdb_set_kv(db_txn2, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
    }

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);

        // txn1
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        status = fdb_get_kv(db_txn1, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);

        // txn2
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db_txn2, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // commit txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        status = fdb_free_block(value);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // txn2
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db_txn2, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // commit txn2
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction simple API test");
}